

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O3

bool __thiscall
uWS::HttpResponse<true>::internalEnd
          (HttpResponse<true> *this,string_view data,int totalSize,bool optional,
          bool allowContentLength)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  void *__buf;
  int __fd;
  ulong uVar6;
  bool bVar7;
  string_view status;
  string_view key;
  string_view value;
  
  uVar6 = data._M_len;
  status._M_str = "200 OK";
  status._M_len = 6;
  writeStatus(this,status);
  if (totalSize == 0) {
    totalSize = (uint)data._M_len;
  }
  lVar3 = us_socket_ext(1,this);
  if ((*(uint *)(lVar3 + 0xb4) & 2) == 0) {
    if ((*(uint *)(lVar3 + 0xb4) & 4) == 0) {
      key._M_str = "uWebSockets";
      key._M_len = 0xb;
      value._M_str = "17";
      value._M_len = 2;
      writeHeader(this,key,value);
      if (allowContentLength) {
        AsyncSocket<true>::write((AsyncSocket<true> *)this,0x151e5a,(void *)0x10,0);
        writeUnsigned(this,totalSize);
        __fd = 0x151e55;
        __buf = (void *)0x4;
      }
      else {
        __fd = 0x151e57;
        __buf = (void *)0x2;
      }
      AsyncSocket<true>::write((AsyncSocket<true> *)this,__fd,__buf,0);
      *(byte *)(lVar3 + 0xb4) = *(byte *)(lVar3 + 0xb4) | 4;
    }
    uVar4 = AsyncSocket<true>::write
                      ((AsyncSocket<true> *)this,(int)data._M_str,(void *)(uVar6 & 0xffffffff),
                       (ulong)optional);
    uVar5 = *(int *)(lVar3 + 0xb0) + (int)uVar4;
    *(uint *)(lVar3 + 0xb0) = uVar5;
    bVar1 = (uVar4 & 0x100000000) == 0;
    bVar2 = (uVar4 & 0xffffffff) == uVar6;
    bVar7 = bVar1 && bVar2;
    if ((!bVar1 || !bVar2) || uVar5 == totalSize) {
      us_socket_timeout(1,this,10);
      uVar5 = *(uint *)(lVar3 + 0xb0);
    }
    if (uVar5 == totalSize) {
      (**(code **)(lVar3 + 0x80))(lVar3 + 0x80,2,lVar3 + 0x70,0x10,0,0);
      (**(code **)(lVar3 + 0x60))(lVar3 + 0x60,2,lVar3 + 0x50,0x10,0,0);
      *(byte *)(lVar3 + 0xb4) = *(byte *)(lVar3 + 0xb4) & 0xf7;
    }
  }
  else {
    if (uVar6 != 0) {
      AsyncSocket<true>::write((AsyncSocket<true> *)this,0x151e57,(void *)0x2,0);
      writeUnsignedHex(this,(uint)data._M_len);
      AsyncSocket<true>::write((AsyncSocket<true> *)this,0x151e57,(void *)0x2,0);
      AsyncSocket<true>::write
                ((AsyncSocket<true> *)this,(int)data._M_str,(void *)(uVar6 & 0xffffffff),0);
    }
    AsyncSocket<true>::write((AsyncSocket<true> *)this,0x151e52,(void *)0x7,0);
    (**(code **)(lVar3 + 0x80))(lVar3 + 0x80,2,lVar3 + 0x70,0x10,0,0);
    (**(code **)(lVar3 + 0x60))(lVar3 + 0x60,2,lVar3 + 0x50,0x10,0,0);
    *(byte *)(lVar3 + 0xb4) = *(byte *)(lVar3 + 0xb4) & 0xf7;
    us_socket_timeout(1,this,10);
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool internalEnd(std::string_view data, int totalSize, bool optional, bool allowContentLength = true) {
        /* Write status if not already done */
        writeStatus(HTTP_200_OK);

        /* If no total size given then assume this chunk is everything */
        if (!totalSize) {
            totalSize = (int) data.length();
        }

        HttpResponseData<SSL> *httpResponseData = getHttpResponseData();
        if (httpResponseData->state & HttpResponseData<SSL>::HTTP_WRITE_CALLED) {

            /* We do not have tryWrite-like functionalities, so ignore optional in this path */

            /* Do not allow sending 0 chunk here */
            if (data.length()) {
                Super::write("\r\n", 2);
                writeUnsignedHex((unsigned int) data.length());
                Super::write("\r\n", 2);

                /* Ignoring optional for now */
                Super::write(data.data(), (int) data.length());
            }

            /* Terminating 0 chunk */
            Super::write("\r\n0\r\n\r\n", 7);

            markDone(httpResponseData);

            /* tryEnd can never fail when in chunked mode, since we do not have tryWrite (yet), only write */
            Super::timeout(HTTP_TIMEOUT_S);
            return true;
        } else {
            /* Write content-length on first call */
            if (!(httpResponseData->state & HttpResponseData<SSL>::HTTP_END_CALLED)) {
                /* Write mark, this propagates to WebSockets too */
                writeMark();

                /* WebSocket upgrades does not allow content-length */
                if (allowContentLength) {
                    /* Even zero is a valid content-length */
                    Super::write("Content-Length: ", 16);
                    writeUnsigned(totalSize);
                    Super::write("\r\n\r\n", 4);
                } else {
                    Super::write("\r\n", 2);
                }

                /* Mark end called */
                httpResponseData->state |= HttpResponseData<SSL>::HTTP_END_CALLED;
            }

            /* Even if we supply no new data to write, its failed boolean is useful to know
             * if it failed to drain any prior failed header writes */

            /* Write as much as possible without causing backpressure */
            auto [written, failed] = Super::write(data.data(), (int) data.length(), optional);
            httpResponseData->offset += written;

            /* Success is when we wrote the entire thing without any failures */
            bool success = (unsigned int) written == data.length() && !failed;

            /* If we are now at the end, start a timeout. Also start a timeout if we failed. */
            if (!success || httpResponseData->offset == totalSize) {
                Super::timeout(HTTP_TIMEOUT_S);
            }

            /* Remove onAborted function if we reach the end */
            if (httpResponseData->offset == totalSize) {
                markDone(httpResponseData);
            }

            return success;
        }
    }